

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenerContainer.h
# Opt level: O2

void __thiscall
ListenerContainer<FooListener>::removeListener
          (ListenerContainer<FooListener> *this,FooListener *listener)

{
  Node *pNVar1;
  iterator ret;
  AutoLock lock;
  iterator local_30;
  AutoLock local_28 [24];
  
  AutoLock::AutoLock(local_28,&this->mMutex);
  pNVar1 = (this->mListenerList).mHead;
  do {
    pNVar1 = pNVar1->next;
    if (pNVar1 == (this->mListenerList).mTail) goto LAB_001025d5;
  } while (pNVar1->val != listener);
  JetHead::list<FooListener_*>::iterator::erase(&local_30);
LAB_001025d5:
  AutoLock::~AutoLock(local_28);
  return;
}

Assistant:

void removeListener(ListenerType *listener)
	{
		AutoLock lock(mMutex);
		
		// The "typename" is necessary here because templates
		// are dirty: the compiler is not yet "aware" of
		// list<T>::iterator as a class type, so in some
		// horrible sense the compiler thinks that
		// "JetHead::list<ListenerType*>::iterator might be a
		// full statement (or variable declaration) on its
		// own.  Adding the "typename" hint allows the compile
		// to realize that the next token is a type (and this to compile).
		for (typename JetHead::list< ListenerType *>::iterator i = mListenerList.begin();
			 i != mListenerList.end(); ++i)
		{
			ListenerType* lnode = *i;
			
			if (lnode == listener)
			{
				i.erase();
				return;
			}
		}
	}